

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_lyb.c
# Opt level: O0

int lyb_parse_data_models(char *data,lyb_state *lybs)

{
  int iVar1;
  lys_module **pplVar2;
  int local_2c;
  int ret;
  int r;
  int i;
  lyb_state *lybs_local;
  char *data_local;
  
  local_2c = lyb_read_number(&lybs->mod_count,4,2,data,lybs);
  if (local_2c < 0) {
    data_local._4_4_ = -1;
  }
  else {
    lybs_local = (lyb_state *)(data + local_2c);
    pplVar2 = (lys_module **)malloc((long)lybs->mod_count << 3);
    lybs->models = pplVar2;
    if (lybs->models == (lys_module **)0x0) {
      ly_log(lybs->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lyb_parse_data_models");
      data_local._4_4_ = -1;
    }
    else {
      for (ret = 0; ret < lybs->mod_count; ret = ret + 1) {
        iVar1 = lyb_parse_model((char *)lybs_local,lybs->models + ret,lybs);
        local_2c = iVar1 + local_2c;
        if (iVar1 < 0) {
          return -1;
        }
        lybs_local = (lyb_state *)((long)&lybs_local->written + (long)iVar1);
      }
      data_local._4_4_ = local_2c;
    }
  }
  return data_local._4_4_;
}

Assistant:

static int
lyb_parse_data_models(const char *data, struct lyb_state *lybs)
{
    int i, r, ret = 0;

    /* read model count */
    ret += (r = lyb_read_number(&lybs->mod_count, sizeof lybs->mod_count, 2, data, lybs));
    LYB_HAVE_READ_RETURN(r, data, -1);

    lybs->models = malloc(lybs->mod_count * sizeof *lybs->models);
    LY_CHECK_ERR_RETURN(!lybs->models, LOGMEM(lybs->ctx), -1);

    /* read modules */
    for (i = 0; i < lybs->mod_count; ++i) {
        ret += (r = lyb_parse_model(data, &lybs->models[i], lybs));
        LYB_HAVE_READ_RETURN(r, data, -1);
    }

    return ret;
}